

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

void flip_level_rnd(level *lev,int flp)

{
  int iVar1;
  undefined4 uVar2;
  mkroom *pmVar3;
  undefined8 uVar4;
  lev_region *plVar5;
  uint uVar6;
  uint uVar7;
  trap *ptVar8;
  obj *poVar9;
  engr *peVar10;
  mkroom **ppmVar11;
  long lVar12;
  mkroom *pmVar13;
  long lVar14;
  long lVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  monst *worm;
  long lVar24;
  long lVar25;
  rm trm;
  
  uVar6 = 0;
  if ((flp & 1U) != 0) {
    uVar6 = mt_random();
    uVar6 = uVar6 & 1;
  }
  if ((flp & 2U) != 0) {
    uVar7 = mt_random();
    uVar6 = uVar6 + (uVar7 & 1) * 2;
  }
  if ((uVar6 & 1) != 0) {
    (lev->upstair).sy = '\x14' - (lev->upstair).sy;
    (lev->dnstair).sy = '\x14' - (lev->dnstair).sy;
    (lev->upladder).sy = '\x14' - (lev->upladder).sy;
    (lev->dnladder).sy = '\x14' - (lev->dnladder).sy;
  }
  if ((uVar6 & 2) != 0) {
    (lev->upstair).sx = 'P' - (lev->upstair).sx;
    (lev->dnstair).sx = 'P' - (lev->dnstair).sx;
    (lev->upladder).sx = 'P' - (lev->upladder).sx;
    (lev->dnladder).sx = 'P' - (lev->dnladder).sx;
  }
  for (ptVar8 = lev->lev_traps; ptVar8 != (trap *)0x0; ptVar8 = ptVar8->ntrap) {
    if (((uVar6 & 1) != 0) && (ptVar8->ty = '\x14' - ptVar8->ty, (ptVar8->field_0x8 & 0x1f) == 7)) {
      (ptVar8->launch).y = '\x14' - (ptVar8->launch).y;
      (ptVar8->vl).v_launch2.y = '\x14' - (ptVar8->vl).v_launch2.y;
    }
    if (((uVar6 & 2) != 0) && (ptVar8->tx = 'P' - ptVar8->tx, (ptVar8->field_0x8 & 0x1f) == 7)) {
      (ptVar8->launch).x = 'P' - (ptVar8->launch).x;
      (ptVar8->vl).v_launch2.x = 'P' - (ptVar8->vl).v_launch2.x;
    }
  }
  for (poVar9 = lev->objlist; poVar9 != (obj *)0x0; poVar9 = poVar9->nobj) {
    if ((uVar6 & 1) != 0) {
      poVar9->oy = '\x14' - poVar9->oy;
    }
    if ((uVar6 & 2) != 0) {
      poVar9->ox = 'P' - poVar9->ox;
    }
  }
  for (poVar9 = lev->buriedobjlist; poVar9 != (obj *)0x0; poVar9 = poVar9->nobj) {
    if ((uVar6 & 1) != 0) {
      poVar9->oy = '\x14' - poVar9->oy;
    }
    if ((uVar6 & 2) != 0) {
      poVar9->ox = 'P' - poVar9->ox;
    }
  }
  for (worm = lev->monlist; worm != (monst *)0x0; worm = worm->nmon) {
    if ((uVar6 & 1) != 0) {
      worm->my = '\x14' - worm->my;
      if ((*(uint *)&worm->field_0x60 >> 0x1c & 1) == 0) {
        if ((*(uint *)&worm->field_0x60 >> 0x19 & 1) == 0) {
          if (worm->wormno != '\0') {
            flip_worm_segs_vertical(lev,worm,0x14);
          }
        }
        else {
          *(char *)((long)&worm[0x1b].movement + 1) =
               '\x14' - *(char *)((long)&worm[0x1b].movement + 1);
          *(char *)((long)&worm[0x1b].mintrinsics + 1) =
               '\x14' - *(char *)((long)&worm[0x1b].mintrinsics + 1);
        }
      }
      else {
        worm->field_0x77 = '\x14' - worm->field_0x77;
      }
    }
    if ((uVar6 & 2) != 0) {
      worm->mx = 'P' - worm->mx;
      if ((*(uint *)&worm->field_0x60 >> 0x1c & 1) == 0) {
        if ((*(uint *)&worm->field_0x60 >> 0x19 & 1) == 0) {
          if (worm->wormno != '\0') {
            flip_worm_segs_horizontal(lev,worm,0x4f);
          }
        }
        else {
          *(char *)&worm[0x1b].movement = 'P' - (char)worm[0x1b].movement;
          *(char *)&worm[0x1b].mintrinsics = 'P' - (char)worm[0x1b].mintrinsics;
        }
      }
      else {
        worm->field_0x76 = 'P' - worm->field_0x76;
      }
    }
  }
  for (peVar10 = lev->lev_engr; plVar5 = lregions, peVar10 != (engr *)0x0;
      peVar10 = peVar10->nxt_engr) {
    if ((uVar6 & 1) != 0) {
      peVar10->engr_y = '\x14' - peVar10->engr_y;
    }
    if ((uVar6 & 2) != 0) {
      peVar10->engr_x = 'P' - peVar10->engr_x;
    }
  }
  lVar12 = (long)num_lregions;
  if (0 < lVar12) {
    lVar14 = 0;
    do {
      if ((uVar6 & 1) != 0) {
        cVar16 = '\x14' - (&(plVar5->inarea).y1)[lVar14];
        (&(plVar5->inarea).y1)[lVar14] = cVar16;
        cVar17 = '\x14' - (&(plVar5->inarea).y2)[lVar14];
        (&(plVar5->inarea).y2)[lVar14] = cVar17;
        if (cVar17 < cVar16) {
          (&(plVar5->inarea).y1)[lVar14] = cVar17;
          (&(plVar5->inarea).y2)[lVar14] = cVar16;
        }
        cVar16 = '\x14' - (&(plVar5->delarea).y1)[lVar14];
        (&(plVar5->delarea).y1)[lVar14] = cVar16;
        cVar17 = '\x14' - (&(plVar5->delarea).y2)[lVar14];
        (&(plVar5->delarea).y2)[lVar14] = cVar17;
        if (cVar17 < cVar16) {
          (&(plVar5->delarea).y1)[lVar14] = cVar17;
          (&(plVar5->delarea).y2)[lVar14] = cVar16;
        }
      }
      if ((uVar6 & 2) != 0) {
        cVar16 = 'P' - (&(plVar5->inarea).x1)[lVar14];
        (&(plVar5->inarea).x1)[lVar14] = cVar16;
        cVar17 = 'P' - (&(plVar5->inarea).x2)[lVar14];
        (&(plVar5->inarea).x2)[lVar14] = cVar17;
        if (cVar17 < cVar16) {
          (&(plVar5->inarea).x1)[lVar14] = cVar17;
          (&(plVar5->inarea).x2)[lVar14] = cVar16;
        }
        cVar16 = 'P' - (&(plVar5->delarea).x1)[lVar14];
        (&(plVar5->delarea).x1)[lVar14] = cVar16;
        cVar17 = 'P' - (&(plVar5->delarea).x2)[lVar14];
        (&(plVar5->delarea).x2)[lVar14] = cVar17;
        if (cVar17 < cVar16) {
          (&(plVar5->delarea).x1)[lVar14] = cVar17;
          (&(plVar5->delarea).x2)[lVar14] = cVar16;
        }
      }
      lVar14 = lVar14 + 0x18;
    } while (lVar12 * 0x18 != lVar14);
  }
  cVar16 = lev->rooms[0].hx;
  if (-1 < cVar16) {
    pmVar3 = lev->rooms;
    ppmVar11 = lev->rooms[0].sbrooms;
    pmVar13 = lev->rooms;
    do {
      if ((uVar6 & 1) != 0) {
        cVar17 = '\x14' - pmVar13->ly;
        pmVar13->ly = cVar17;
        cVar18 = '\x14' - pmVar13->hy;
        pmVar13->hy = cVar18;
        if (cVar18 < cVar17) {
          pmVar13->ly = cVar18;
          pmVar13->hy = cVar17;
        }
      }
      if ((uVar6 & 2) != 0) {
        cVar17 = 'P' - pmVar13->lx;
        pmVar13->lx = cVar17;
        cVar16 = 'P' - cVar16;
        pmVar3->hx = cVar16;
        if (cVar16 < cVar17) {
          pmVar13->lx = cVar16;
          pmVar3->hx = cVar17;
        }
      }
      cVar16 = pmVar13->nsubrooms;
      if (0 < (long)cVar16) {
        lVar12 = 0;
        do {
          pmVar3 = ppmVar11[lVar12];
          if ((uVar6 & 1) != 0) {
            cVar17 = '\x14' - pmVar3->ly;
            pmVar3->ly = cVar17;
            cVar18 = '\x14' - pmVar3->hy;
            pmVar3->hy = cVar18;
            if (cVar18 < cVar17) {
              pmVar3->ly = cVar18;
              pmVar3->hy = cVar17;
            }
          }
          if ((uVar6 & 2) != 0) {
            cVar17 = 'P' - pmVar3->lx;
            pmVar3->lx = cVar17;
            cVar18 = 'P' - pmVar3->hx;
            pmVar3->hx = cVar18;
            if (cVar18 < cVar17) {
              pmVar3->lx = cVar18;
              pmVar3->hx = cVar17;
            }
          }
          lVar12 = lVar12 + 1;
        } while (cVar16 != lVar12);
      }
      cVar16 = pmVar13[1].hx;
      pmVar3 = pmVar13 + 1;
      ppmVar11 = ppmVar11 + 0x1b;
      pmVar13 = pmVar13 + 1;
    } while (-1 < cVar16);
  }
  iVar1 = lev->doorindex;
  if (0 < (long)iVar1) {
    lVar12 = 0;
    do {
      if ((uVar6 & 1) != 0) {
        lev->doors[lVar12].y = '\x14' - lev->doors[lVar12].y;
      }
      if ((uVar6 & 2) != 0) {
        lev->doors[lVar12].x = 'P' - lev->doors[lVar12].x;
      }
      lVar12 = lVar12 + 1;
    } while (iVar1 != lVar12);
  }
  if ((uVar6 & 1) != 0) {
    lVar12 = 1;
    lVar22 = 0x4fa8;
    lVar20 = 0x5048;
    lVar14 = 0x22c;
    lVar24 = 0x13c;
    do {
      lVar19 = 0xb;
      lVar15 = lVar14;
      lVar21 = lVar20;
      lVar23 = lVar22;
      lVar25 = lVar24;
      do {
        flip_drawbridge_vertical((rm *)(lev->levname + lVar25));
        flip_drawbridge_vertical((rm *)(lev->levname + lVar15));
        uVar2 = *(undefined4 *)(lev->levname + lVar25 + 8);
        uVar4 = *(undefined8 *)(lev->levname + lVar25);
        *(undefined4 *)(lev->levname + lVar25 + 8) = *(undefined4 *)(lev->levname + lVar15 + 8);
        *(undefined8 *)(lev->levname + lVar25) = *(undefined8 *)(lev->levname + lVar15);
        *(undefined8 *)(lev->levname + lVar15) = uVar4;
        *(undefined4 *)(lev->levname + lVar15 + 8) = uVar2;
        uVar4 = *(undefined8 *)(lev->levname + lVar23);
        *(undefined8 *)(lev->levname + lVar23) = *(undefined8 *)(lev->levname + lVar21);
        *(undefined8 *)(lev->levname + lVar21) = uVar4;
        uVar4 = *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar23);
        *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar23) =
             *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar21);
        *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar21) = uVar4;
        lVar23 = lVar23 + 8;
        lVar21 = lVar21 + -8;
        lVar15 = lVar15 + -0xc;
        lVar25 = lVar25 + 0xc;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      lVar12 = lVar12 + 1;
      lVar22 = lVar22 + 0xa8;
      lVar20 = lVar20 + 0xa8;
      lVar14 = lVar14 + 0xfc;
      lVar24 = lVar24 + 0xfc;
    } while (lVar12 != 0x50);
  }
  if ((uVar6 & 2) != 0) {
    lVar12 = 1;
    lVar24 = 0x82d8;
    lVar20 = 0x4fa8;
    lVar22 = 0x4e04;
    lVar14 = 0x13c;
    do {
      lVar19 = 0x15;
      lVar15 = lVar14;
      lVar21 = lVar20;
      lVar23 = lVar22;
      lVar25 = lVar24;
      do {
        flip_drawbridge_horizontal((rm *)(lev->levname + lVar15));
        flip_drawbridge_horizontal((rm *)(lev->levname + lVar23));
        uVar2 = *(undefined4 *)(lev->levname + lVar15 + 8);
        uVar4 = *(undefined8 *)(lev->levname + lVar15);
        *(undefined4 *)(lev->levname + lVar15 + 8) = *(undefined4 *)(lev->levname + lVar23 + 8);
        *(undefined8 *)(lev->levname + lVar15) = *(undefined8 *)(lev->levname + lVar23);
        *(undefined8 *)(lev->levname + lVar23) = uVar4;
        *(undefined4 *)(lev->levname + lVar23 + 8) = uVar2;
        uVar4 = *(undefined8 *)(lev->levname + lVar21);
        *(undefined8 *)(lev->levname + lVar21) = *(undefined8 *)(lev->levname + lVar25);
        *(undefined8 *)(lev->levname + lVar25) = uVar4;
        uVar4 = *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar21);
        *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar21) =
             *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar25);
        *(undefined8 *)(&lev->locations[0x35][1].field_0x8 + lVar25) = uVar4;
        lVar25 = lVar25 + 8;
        lVar21 = lVar21 + 8;
        lVar23 = lVar23 + 0xc;
        lVar15 = lVar15 + 0xc;
        lVar19 = lVar19 + -1;
      } while (lVar19 != 0);
      lVar12 = lVar12 + 1;
      lVar24 = lVar24 + -0xa8;
      lVar20 = lVar20 + 0xa8;
      lVar22 = lVar22 + -0xfc;
      lVar14 = lVar14 + 0xfc;
    } while (lVar12 != 0x28);
  }
  wall_extends(lev,1,0,0x4f,0x14);
  return;
}

Assistant:

static void flip_level_rnd(struct level *lev, int flp)
{
	int c = 0;
	if ((flp & 1) && rn2(2)) c |= 1;
	if ((flp & 2) && rn2(2)) c |= 2;
	flip_level(lev, c);
}